

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::NativeSurface<eglu::NativePixmap>::~NativeSurface
          (NativeSurface<eglu::NativePixmap> *this)

{
  NativePixmap *pNVar1;
  
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__NativeSurface_0215caf0;
  pNVar1 = (this->m_native).
           super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data.ptr;
  if (pNVar1 != (NativePixmap *)0x0) {
    (**(code **)(*(long *)pNVar1 + 8))();
    (this->m_native).super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.
    m_data.ptr = (NativePixmap *)0x0;
  }
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__ManagedSurface_0215ca88;
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::reset
            (&(this->super_ManagedSurface).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit		NativeSurface	(MovePtr<UniqueSurface>	surface,
									 MovePtr<T>				native)
						: ManagedSurface	(surface)
						, m_native			(native) {}